

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderInterp *this,Index segment_index,Index func_index)

{
  pointer *ppEVar1;
  pointer pEVar2;
  iterator __position;
  Result RVar3;
  Enum EVar4;
  Location local_98;
  Var local_70;
  
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,func_index,&local_98);
  RVar3 = SharedValidator::OnElemSegmentElemExpr_RefFunc
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    pEVar2 = (this->module_->elems).
             super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_98.filename.data_ = (char *)CONCAT44(func_index,RefFunc);
    __position._M_current =
         pEVar2[-1].elements.
         super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        pEVar2[-1].elements.
        super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::
      _M_realloc_insert<wabt::interp::ElemExpr>
                (&pEVar2[-1].elements,__position,(ElemExpr *)&local_98);
    }
    else {
      *__position._M_current = (ElemExpr)local_98.filename.data_;
      ppEVar1 = &pEVar2[-1].elements.
                 super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                         Index func_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefFunc(loc, Var(func_index)));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefFunc, func_index});
  return Result::Ok;
}